

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

size_t __thiscall gpu::Context::getMaxMemAlloc(Context *this)

{
  Type TVar1;
  element_type *this_00;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  Context local_28;
  size_t max_mem_alloc_size;
  Context *this_local;
  
  local_28.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  max_mem_alloc_size = (size_t)this;
  TVar1 = type(this);
  if (TVar1 == TypeOpenCL) {
    cl(&local_28);
    this_00 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_28);
    local_28.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ocl::OpenCLEngine::maxMemAllocSize(this_00)
    ;
    std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)&local_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/context.cpp"
               ,&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"No GPU context!",&local_81);
    raiseException(&local_58,0xeb,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return (size_t)local_28.data_ref_.
                 super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
}

Assistant:

size_t Context::getMaxMemAlloc()
{
	size_t max_mem_alloc_size = 0;

#ifdef CUDA_SUPPORT
	if (type() == gpu::Context::TypeCUDA) {
		size_t total_mem_size = 0;
		size_t free_mem_size = 0;
		CUDA_SAFE_CALL(cudaMemGetInfo(&free_mem_size, &total_mem_size));
		max_mem_alloc_size = total_mem_size / 2;
	} else
#endif
	if (type() == gpu::Context::TypeOpenCL) {
		max_mem_alloc_size = cl()->maxMemAllocSize();
	} else {
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	return max_mem_alloc_size;
}